

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O3

string * dlib::select_oldest_file
                   (string *__return_storage_ptr__,string *filename1,string *filename2)

{
  pointer pcVar1;
  file f2;
  file f1;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  duration local_d8;
  uint64 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  duration local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  _Alloc_hider local_58;
  char local_48 [16];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  local_88.__r = 0;
  local_d0 = 0;
  local_118 = local_108;
  local_110 = 0;
  local_108[0] = 0;
  local_f8 = local_e8;
  local_f0 = 0;
  local_e8[0] = 0;
  local_d8.__r = 0;
  file::file((file *)local_80,filename1);
  local_d0 = (uint64)local_80;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_58);
  local_88 = local_38.__d.__r;
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  file::file((file *)local_80,filename2);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_58);
  local_d8 = local_38.__d.__r;
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  if (local_88.__r < local_d8.__r) {
    filename2 = filename1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename2->_M_string_length);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string select_oldest_file (
        const std::string& filename1,
        const std::string& filename2
    )
    {
        file f1, f2;
        try{f1 = file(filename1);} catch(file::file_not_found&) { return filename1; }
        try{f2 = file(filename2);} catch(file::file_not_found&) { return filename2; }

        if (f1.last_modified() < f2.last_modified())
            return filename1;
        else
            return filename2;
    }